

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_callback_ret.cpp
# Opt level: O0

long data_cb_ret_nframes_minus_one
               (cubeb_stream *stream,void *user,void *inputbuffer,void *outputbuffer,long nframes)

{
  bool bVar1;
  __int_type _Var2;
  Message *message;
  char *message_00;
  long in_RCX;
  __atomic_base<int> *in_RSI;
  long in_R8;
  long i;
  short *ob;
  AssertionResult gtest_ar_;
  user_state_callback_ret *u;
  undefined8 in_stack_ffffffffffffff88;
  undefined1 success;
  String *in_stack_ffffffffffffff90;
  long lVar3;
  __atomic_base<int> *in_stack_ffffffffffffff98;
  Message *in_stack_ffffffffffffffa0;
  AssertHelper local_50 [2];
  AssertionResult local_40;
  __atomic_base<int> *local_30;
  long local_28;
  long local_20;
  
  success = (undefined1)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  local_30 = in_RSI;
  local_28 = in_R8;
  local_20 = in_RCX;
  _Var2 = std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffff98);
  if (_Var2 == 0) {
    std::__atomic_base<int>::operator=
              (in_stack_ffffffffffffff98,(__int_type)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  }
  std::__atomic_base<int>::operator++(local_30,0);
  if (local_28 < 1) {
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_ffffffffffffff90,(bool)success);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
    if (!bVar1) {
      testing::Message::Message(in_stack_ffffffffffffffa0);
      message = testing::Message::operator<<
                          (in_stack_ffffffffffffffa0,(char (*) [42])in_stack_ffffffffffffff98);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)&stack0xffffffffffffffa0,&local_40,"false","false","true");
      message_00 = testing::internal::String::c_str((String *)&stack0xffffffffffffffa0);
      testing::internal::AssertHelper::AssertHelper
                (local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_callback_ret.cpp"
                 ,0x44,message_00);
      testing::internal::AssertHelper::operator=(local_50,message);
      testing::internal::AssertHelper::~AssertHelper(local_50);
      testing::internal::String::~String(in_stack_ffffffffffffff90);
      testing::Message::~Message((Message *)0x1087d5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1087df);
  }
  if (local_20 != 0) {
    for (lVar3 = 0; lVar3 < local_28 + -1; lVar3 = lVar3 + 1) {
      *(undefined2 *)(local_20 + lVar3 * 2) = 0;
    }
  }
  return local_28 + -1;
}

Assistant:

long data_cb_ret_nframes_minus_one(cubeb_stream * stream, void * user, const void * inputbuffer, void * outputbuffer, long nframes)
{
  user_state_callback_ret * u = (user_state_callback_ret *)user;
  // If this is the first time the callback has been called set our expected
  // callback count
  if (u->cb_count == 0) {
    u->expected_cb_count = 1;
  }
  u->cb_count++;
  if (nframes < 1) {
    // This shouldn't happen
    EXPECT_TRUE(false) << "nframes should not be 0 in data callback!";
  }
  if (outputbuffer != NULL) {
    // If we have an output buffer insert silence
    short * ob = (short *) outputbuffer;
    for (long i = 0; i < nframes - 1; i++) {
      ob[i] = 0;
    }
  }
  return nframes - 1;
}